

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O1

size_t __thiscall rtc::Buffer::size(Buffer *this)

{
  ostream *poVar1;
  bool bVar2;
  FatalMessage local_190;
  
  if (this->capacity_ == 0 ||
      (this->data_)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>
      ._M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl != (uchar *)0x0) {
    bVar2 = this->size_ <= this->capacity_;
  }
  else {
    bVar2 = false;
  }
  if (bVar2) {
    return this->size_;
  }
  FatalMessage::FatalMessage
            (&local_190,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/buffer.h"
             ,0x5c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_190,"Check failed: IsConsistent()",0x1c);
  std::ios::widen((char)(ostream *)&local_190 + (char)*(undefined8 *)(local_190._0_8_ + -0x18));
  std::ostream::put((char)&local_190);
  poVar1 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"# ",2);
  FatalMessage::~FatalMessage(&local_190);
}

Assistant:

size_t size() const {
    RTC_DCHECK(IsConsistent());
    return size_;
  }